

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O2

void anon_unknown.dwarf_1b0988::readFirstPart(string *fn)

{
  int pixelType;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  DeepScanLineInputFile part_1;
  int local_1cc;
  Box2i b2;
  Array2D<unsigned_int> sampleCount;
  InputFile part;
  int local_18c;
  Array2D<Imath_3_2::half_*> deepHData;
  Array2D<float_*> deepFData;
  Array2D<unsigned_int_*> deepUData;
  Array2D<Imath_3_2::half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  FrameBuffer frameBuffer;
  
  uData._sizeX = 0;
  uData._sizeY = 0;
  uData._data = (uint *)0x0;
  fData._sizeX = 0;
  fData._sizeY = 0;
  fData._data = (float *)0x0;
  hData._sizeX = 0;
  hData._sizeY = 0;
  hData._data = (half *)0x0;
  deepUData._sizeX = 0;
  deepUData._sizeY = 0;
  deepUData._data = (uint **)0x0;
  deepFData._sizeX = 0;
  deepFData._sizeY = 0;
  deepFData._data = (float **)0x0;
  deepHData._sizeX = 0;
  deepHData._sizeY = 0;
  deepHData._data = (half **)0x0;
  sampleCount._sizeX = 0;
  sampleCount._sizeY = 0;
  sampleCount._data = (uint *)0x0;
  std::operator<<((ostream *)&std::cout,"Reading first part ");
  std::ostream::flush();
  if (*(anonymous_namespace)::partTypes < 4) {
    pixelType = *(anonymous_namespace)::pixelTypes;
    switch(*(anonymous_namespace)::partTypes) {
    case 0:
      pcVar1 = (fn->_M_dataplus)._M_p;
      iVar3 = Imf_3_2::globalThreadCount();
      Imf_3_2::InputFile::InputFile(&part,pcVar1,iVar3);
      iVar8 = random_int(0x10b);
      iVar4 = random_int(0x10b);
      iVar3 = iVar4;
      if (iVar8 < iVar4) {
        iVar3 = iVar8;
      }
      if (iVar4 < iVar8) {
        iVar4 = iVar8;
      }
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      setInputFrameBuffer(&frameBuffer,pixelType,&uData,&fData,&hData,0xc1,0x10b);
      Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&part);
      Imf_3_2::InputFile::readPixels((int)&part,iVar3);
      if (pixelType == 0) {
        bVar2 = checkPixels<unsigned_int>(&uData,0,0xc0,iVar3,iVar4,0xc1);
        if (!bVar2) {
          __assert_fail("checkPixels<unsigned int> ( uData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                        ,0x450,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 1) {
        bVar2 = checkPixels<float>(&fData,0,0xc0,iVar3,iVar4,0xc1);
        if (!bVar2) {
          __assert_fail("checkPixels<float> ( fData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                        ,0x454,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if ((pixelType == 2) &&
              (bVar2 = checkPixels<Imath_3_2::half>(&hData,0,0xc0,iVar3,iVar4,0xc1), !bVar2)) {
        __assert_fail("checkPixels<half> (hData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x458,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&frameBuffer);
      Imf_3_2::InputFile::~InputFile(&part);
      break;
    case 1:
      pcVar1 = (fn->_M_dataplus)._M_p;
      iVar3 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledInputFile::TiledInputFile((TiledInputFile *)&part,pcVar1,iVar3);
      iVar3 = Imf_3_2::TiledInputFile::numXLevels();
      iVar4 = Imf_3_2::TiledInputFile::numYLevels();
      iVar5 = random_int(iVar3);
      random_int(iVar4);
      iVar6 = Imf_3_2::TiledInputFile::levelWidth((int)&part);
      iVar7 = Imf_3_2::TiledInputFile::levelHeight((int)&part);
      iVar3 = Imf_3_2::TiledInputFile::numXTiles((int)&part);
      iVar8 = Imf_3_2::TiledInputFile::numYTiles((int)&part);
      iVar9 = random_int(iVar3);
      iVar4 = random_int(iVar3);
      iVar10 = random_int(iVar8);
      iVar8 = random_int(iVar8);
      iVar3 = iVar4;
      if (iVar9 < iVar4) {
        iVar3 = iVar9;
      }
      if (iVar4 < iVar9) {
        iVar4 = iVar9;
      }
      iVar9 = iVar8;
      if (iVar10 < iVar8) {
        iVar9 = iVar10;
      }
      if (iVar8 < iVar10) {
        iVar8 = iVar10;
      }
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      setInputFrameBuffer(&frameBuffer,pixelType,&uData,&fData,&hData,iVar6,iVar7);
      Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&part);
      Imf_3_2::TiledInputFile::readTiles((int)&part,iVar3,iVar4,iVar9,iVar8,iVar5);
      Imf_3_2::TiledInputFile::dataWindowForTile((int)&part_1,(int)&part,iVar3,iVar9);
      Imf_3_2::TiledInputFile::dataWindowForTile((int)&b2,(int)&part,iVar4,iVar8);
      if (pixelType == 0) {
        bVar2 = checkPixels<unsigned_int>(&uData,_part_1,b2.max.x,local_1cc,b2.max.y,iVar6);
        if (!bVar2) {
          __assert_fail("checkPixels<unsigned int> ( uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                        ,0x485,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 1) {
        bVar2 = checkPixels<float>(&fData,_part_1,b2.max.x,local_1cc,b2.max.y,iVar6);
        if (!bVar2) {
          __assert_fail("checkPixels<float> ( fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                        ,0x489,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if ((pixelType == 2) &&
              (bVar2 = checkPixels<Imath_3_2::half>
                                 (&hData,_part_1,b2.max.x,local_1cc,b2.max.y,iVar6), !bVar2)) {
        __assert_fail("checkPixels<half> ( hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x48d,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&frameBuffer);
      Imf_3_2::TiledInputFile::~TiledInputFile((TiledInputFile *)&part);
      break;
    case 2:
      pcVar1 = (fn->_M_dataplus)._M_p;
      iVar3 = Imf_3_2::globalThreadCount();
      Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile(&part_1,pcVar1,iVar3);
      Imf_3_2::DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)&frameBuffer);
      Imf_3_2::Array2D<unsigned_int>::resizeErase(&sampleCount,0x10b,0xc1);
      Imf_3_2::Slice::Slice
                ((Slice *)&part,UINT,(char *)sampleCount._data,4,0x304,1,1,0.0,false,false);
      Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
      setInputDeepFrameBuffer
                ((DeepFrameBuffer *)&frameBuffer,pixelType,&deepUData,&deepFData,&deepHData,0xc1,
                 0x10b);
      Imf_3_2::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)&part_1);
      iVar8 = random_int(0x10b);
      iVar4 = random_int(0x10b);
      iVar3 = iVar4;
      if (iVar8 < iVar4) {
        iVar3 = iVar8;
      }
      if (iVar4 < iVar8) {
        iVar4 = iVar8;
      }
      Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts((int)&part_1,iVar3);
      bVar2 = checkSampleCount(&sampleCount,0,0xc0,iVar3,iVar4,0xc1);
      if (!bVar2) {
        __assert_fail("checkSampleCount (sampleCount, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x4b1,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
      allocatePixels(pixelType,&sampleCount,&deepUData,&deepFData,&deepHData,0,0xc0,iVar3,iVar4);
      Imf_3_2::DeepScanLineInputFile::readPixels((int)&part_1,iVar3);
      if (pixelType == 2) {
        bVar2 = checkPixels<Imath_3_2::half>(&sampleCount,&deepHData,0,0xc0,iVar3,iVar4,0xc1);
        if (!bVar2) {
          __assert_fail("checkPixels<half> ( sampleCount, deepHData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                        ,0x4cc,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 1) {
        bVar2 = checkPixels<float>(&sampleCount,&deepFData,0,0xc0,iVar3,iVar4,0xc1);
        if (!bVar2) {
          __assert_fail("checkPixels<float> ( sampleCount, deepFData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                        ,0x4c8,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if ((pixelType == 0) &&
              (bVar2 = checkPixels<unsigned_int>(&sampleCount,&deepUData,0,0xc0,iVar3,iVar4,0xc1),
              !bVar2)) {
        __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, 0, width - 1, l1, l2, width)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x4c4,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
      releasePixels(pixelType,&deepUData,&deepFData,&deepHData,0,0xc0,iVar3,iVar4);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_3_2::DeepScanLineInputFile::~DeepScanLineInputFile(&part_1);
      break;
    case 3:
      pcVar1 = (fn->_M_dataplus)._M_p;
      iVar3 = Imf_3_2::globalThreadCount();
      Imf_3_2::DeepTiledInputFile::DeepTiledInputFile((DeepTiledInputFile *)&part_1,pcVar1,iVar3);
      iVar3 = Imf_3_2::DeepTiledInputFile::numXLevels();
      iVar4 = Imf_3_2::DeepTiledInputFile::numYLevels();
      iVar5 = random_int(iVar3);
      random_int(iVar4);
      iVar6 = Imf_3_2::DeepTiledInputFile::levelWidth((int)&part_1);
      iVar7 = Imf_3_2::DeepTiledInputFile::levelHeight((int)&part_1);
      iVar3 = Imf_3_2::DeepTiledInputFile::numXTiles((int)&part_1);
      iVar8 = Imf_3_2::DeepTiledInputFile::numYTiles((int)&part_1);
      iVar9 = random_int(iVar3);
      iVar4 = random_int(iVar3);
      iVar10 = random_int(iVar8);
      iVar8 = random_int(iVar8);
      iVar3 = iVar4;
      if (iVar9 < iVar4) {
        iVar3 = iVar9;
      }
      if (iVar4 < iVar9) {
        iVar4 = iVar9;
      }
      iVar9 = iVar8;
      if (iVar10 < iVar8) {
        iVar9 = iVar10;
      }
      if (iVar8 < iVar10) {
        iVar8 = iVar10;
      }
      Imf_3_2::DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)&frameBuffer);
      Imf_3_2::Array2D<unsigned_int>::resizeErase(&sampleCount,(long)iVar7,(long)iVar6);
      Imf_3_2::Slice::Slice
                ((Slice *)&part,UINT,(char *)sampleCount._data,4,(long)iVar6 << 2,1,1,0.0,false,
                 false);
      Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
      setInputDeepFrameBuffer
                ((DeepFrameBuffer *)&frameBuffer,pixelType,&deepUData,&deepFData,&deepHData,iVar6,
                 iVar7);
      Imf_3_2::DeepTiledInputFile::setFrameBuffer((DeepFrameBuffer *)&part_1);
      Imf_3_2::DeepTiledInputFile::readPixelSampleCounts((int)&part_1,iVar3,iVar4,iVar9,iVar8,iVar5)
      ;
      Imf_3_2::DeepTiledInputFile::dataWindowForTile((int)&part,(int)&part_1,iVar3,iVar9);
      Imf_3_2::DeepTiledInputFile::dataWindowForTile((int)&b2,(int)&part_1,iVar4,iVar8);
      bVar2 = checkSampleCount(&sampleCount,_part,b2.max.x,local_18c,b2.max.y,iVar6);
      if (!bVar2) {
        __assert_fail("checkSampleCount ( sampleCount, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x506,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
      allocatePixels(pixelType,&sampleCount,&deepUData,&deepFData,&deepHData,_part,b2.max.x,
                     local_18c,b2.max.y);
      Imf_3_2::DeepTiledInputFile::readTiles((int)&part_1,iVar3,iVar4,iVar9,iVar8,iVar5);
      if (pixelType == 2) {
        bVar2 = checkPixels<Imath_3_2::half>
                          (&sampleCount,&deepHData,_part,b2.max.x,local_18c,b2.max.y,iVar6);
        if (!bVar2) {
          __assert_fail("checkPixels<half> ( sampleCount, deepHData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                        ,0x533,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 1) {
        bVar2 = checkPixels<float>(&sampleCount,&deepFData,_part,b2.max.x,local_18c,b2.max.y,iVar6);
        if (!bVar2) {
          __assert_fail("checkPixels<float> ( sampleCount, deepFData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                        ,0x529,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if ((pixelType == 0) &&
              (bVar2 = checkPixels<unsigned_int>
                                 (&sampleCount,&deepUData,_part,b2.max.x,local_18c,b2.max.y,iVar6),
              !bVar2)) {
        __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x51f,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
      releasePixels(pixelType,&deepUData,&deepFData,&deepHData,_part,b2.max.x,local_18c,b2.max.y);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_3_2::DeepTiledInputFile::~DeepTiledInputFile((DeepTiledInputFile *)&part_1);
    }
  }
  Imf_3_2::Array2D<unsigned_int>::~Array2D(&sampleCount);
  Imf_3_2::Array2D<Imath_3_2::half_*>::~Array2D(&deepHData);
  Imf_3_2::Array2D<float_*>::~Array2D(&deepFData);
  Imf_3_2::Array2D<unsigned_int_*>::~Array2D(&deepUData);
  Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&hData);
  Imf_3_2::Array2D<float>::~Array2D(&fData);
  Imf_3_2::Array2D<unsigned_int>::~Array2D(&uData);
  return;
}

Assistant:

void
readFirstPart (const std::string& fn)
{
    Array2D<unsigned int> uData;
    Array2D<float>        fData;
    Array2D<half>         hData;

    Array2D<unsigned int*> deepUData;
    Array2D<float*>        deepFData;
    Array2D<half*>         deepHData;

    Array2D<unsigned int> sampleCount;

    cout << "Reading first part " << flush;
    int pixelType = pixelTypes[0];
    int partType  = partTypes[0];
    int levelMode = levelModes[0];
    switch (partType)
    {
        case 0: {
            InputFile part (fn.c_str ());

            int l1, l2;
            l1 = random_int (height);
            l2 = random_int (height);
            if (l1 > l2) swap (l1, l2);

            FrameBuffer frameBuffer;
            setInputFrameBuffer (
                frameBuffer, pixelType, uData, fData, hData, width, height);

            part.setFrameBuffer (frameBuffer);
            part.readPixels (l1, l2);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        uData, 0, width - 1, l1, l2, width));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        fData, 0, width - 1, l1, l2, width));
                    break;
                case 2:
                    assert (
                        checkPixels<half> (hData, 0, width - 1, l1, l2, width));
                    break;
            }

            break;
        }
        case 1: {
            TiledInputFile part (fn.c_str ());

            int tx1, tx2, ty1, ty2;
            int lx, ly;

            int numXLevels = part.numXLevels ();
            int numYLevels = part.numYLevels ();

            lx = random_int (numXLevels);
            ly = random_int (numYLevels);
            if (levelMode == 1) ly = lx;

            int w = part.levelWidth (lx);
            int h = part.levelHeight (ly);

            int numXTiles = part.numXTiles (lx);
            int numYTiles = part.numYTiles (ly);
            tx1           = random_int (numXTiles);
            tx2           = random_int (numXTiles);
            ty1           = random_int (numYTiles);
            ty2           = random_int (numYTiles);
            if (tx1 > tx2) swap (tx1, tx2);
            if (ty1 > ty2) swap (ty1, ty2);

            FrameBuffer frameBuffer;
            setInputFrameBuffer (
                frameBuffer, pixelType, uData, fData, hData, w, h);

            part.setFrameBuffer (frameBuffer);
            part.readTiles (tx1, tx2, ty1, ty2, lx, ly);

            Box2i b1 = part.dataWindowForTile (tx1, ty1, lx, ly);
            Box2i b2 = part.dataWindowForTile (tx2, ty2, lx, ly);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 2:
                    assert (checkPixels<half> (
                        hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
            }

            break;
        }
        case 2: {
            DeepScanLineInputFile part (fn.c_str ());

            DeepFrameBuffer frameBuffer;

            sampleCount.resizeErase (height, width);
            frameBuffer.insertSampleCountSlice (Slice (
                OPENEXR_IMF_NAMESPACE::UINT,
                (char*) (&sampleCount[0][0]),
                sizeof (unsigned int) * 1,
                sizeof (unsigned int) * width));

            setInputDeepFrameBuffer (
                frameBuffer,
                pixelType,
                deepUData,
                deepFData,
                deepHData,
                width,
                height);

            part.setFrameBuffer (frameBuffer);

            int l1, l2;
            l1 = random_int (height);
            l2 = random_int (height);
            if (l1 > l2) swap (l1, l2);

            part.readPixelSampleCounts (l1, l2);
            assert (
                checkSampleCount (sampleCount, 0, width - 1, l1, l2, width));

            allocatePixels (
                pixelType,
                sampleCount,
                deepUData,
                deepFData,
                deepHData,
                0,
                width - 1,
                l1,
                l2);

            part.readPixels (l1, l2);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        sampleCount, deepUData, 0, width - 1, l1, l2, width));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        sampleCount, deepFData, 0, width - 1, l1, l2, width));
                    break;
                case 2:
                    assert (checkPixels<half> (
                        sampleCount, deepHData, 0, width - 1, l1, l2, width));
                    break;
            }

            releasePixels (
                pixelType,
                deepUData,
                deepFData,
                deepHData,
                0,
                width - 1,
                l1,
                l2);

            break;
        }
        case 3: {
            DeepTiledInputFile part (fn.c_str ());
            int                numXLevels = part.numXLevels ();
            int                numYLevels = part.numYLevels ();

            int tx1, tx2, ty1, ty2;
            int lx, ly;
            lx = random_int (numXLevels);
            ly = random_int (numYLevels);
            if (levelMode == 1) ly = lx;

            int w = part.levelWidth (lx);
            int h = part.levelHeight (ly);

            int numXTiles = part.numXTiles (lx);
            int numYTiles = part.numYTiles (ly);
            tx1           = random_int (numXTiles);
            tx2           = random_int (numXTiles);
            ty1           = random_int (numYTiles);
            ty2           = random_int (numYTiles);
            if (tx1 > tx2) swap (tx1, tx2);
            if (ty1 > ty2) swap (ty1, ty2);

            DeepFrameBuffer frameBuffer;

            sampleCount.resizeErase (h, w);
            frameBuffer.insertSampleCountSlice (Slice (
                IMF::UINT,
                (char*) (&sampleCount[0][0]),
                sizeof (unsigned int) * 1,
                sizeof (unsigned int) * w));

            setInputDeepFrameBuffer (
                frameBuffer, pixelType, deepUData, deepFData, deepHData, w, h);

            part.setFrameBuffer (frameBuffer);

            part.readPixelSampleCounts (tx1, tx2, ty1, ty2, lx, ly);

            Box2i b1 = part.dataWindowForTile (tx1, ty1, lx, ly);
            Box2i b2 = part.dataWindowForTile (tx2, ty2, lx, ly);
            assert (checkSampleCount (
                sampleCount, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));

            allocatePixels (
                pixelType,
                sampleCount,
                deepUData,
                deepFData,
                deepHData,
                b1.min.x,
                b2.max.x,
                b1.min.y,
                b2.max.y);

            part.readTiles (tx1, tx2, ty1, ty2, lx, ly);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        sampleCount,
                        deepUData,
                        b1.min.x,
                        b2.max.x,
                        b1.min.y,
                        b2.max.y,
                        w));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        sampleCount,
                        deepFData,
                        b1.min.x,
                        b2.max.x,
                        b1.min.y,
                        b2.max.y,
                        w));
                    break;
                case 2:
                    assert (checkPixels<half> (
                        sampleCount,
                        deepHData,
                        b1.min.x,
                        b2.max.x,
                        b1.min.y,
                        b2.max.y,
                        w));
                    break;
            }

            releasePixels (
                pixelType,
                deepUData,
                deepFData,
                deepHData,
                b1.min.x,
                b2.max.x,
                b1.min.y,
                b2.max.y);

            break;
        }
    }
}